

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O3

int intlog2(int x)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  uVar1 = 0;
  if (0 < x) {
    uVar1 = x;
  }
  iVar3 = -1;
  do {
    iVar4 = iVar3;
    iVar3 = iVar4 + 1;
  } while (uVar1 >> ((byte)iVar3 & 0x1f) != 0);
  if (uVar1 != 1 << ((byte)iVar4 & 0x1f)) {
    iVar4 = iVar3;
  }
  iVar2 = 0;
  if (iVar3 != 0) {
    iVar2 = iVar4;
  }
  return iVar2;
}

Assistant:

int intlog2(int x)
{
    int log = 0;
    if (x < 0) { x = 0; }
    while ((x >> log) > 0)
    {
        log++;
    }
    if (log > 0 && x == 1<<(log-1)) { log--; }
    return log;
}